

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
::~table_core(table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::OpaqueInstancePath::Entry,_void>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
              *this)

{
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
  ::
  for_all_elements<boost::unordered::detail::foa::table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>::~for_all_elements()::_lambda(std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>*)_1_>
            (&this->arrays,(anon_class_8_1_8991fb9c)this);
  delete_arrays(this,&this->arrays);
  return;
}

Assistant:

~table_core() noexcept {
        for_all_elements([this](element_type* p) { destroy_element(p); });
        delete_arrays(arrays);
    }